

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O2

int faup_snapshot_file_unzip(char *zipfile)

{
  char *filepath;
  FILE *__stream;
  int iVar1;
  mz_uint mVar2;
  mz_bool mVar3;
  int *piVar4;
  mz_uint file_index;
  char *url_snapshot_file;
  mz_zip_archive zip_archive;
  mz_zip_archive_file_stat file_stat;
  
  url_snapshot_file = (char *)0x0;
  iVar1 = asprintf(&url_snapshot_file,"%s.urls",zipfile);
  if (iVar1 < 0) {
    fwrite("Error: cannot concatenate snapshot file with zip file!\n",0x37,1,_stderr);
LAB_001171c8:
    iVar1 = -1;
  }
  else {
    zip_archive.m_pIO_opaque = (void *)0x0;
    zip_archive.m_pState = (mz_zip_internal_state *)0x0;
    zip_archive.m_pWrite = (mz_file_write_func)0x0;
    zip_archive.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    zip_archive.m_pAlloc_opaque = (void *)0x0;
    zip_archive.m_pRead = (mz_file_read_func)0x0;
    zip_archive.m_pFree = (mz_free_func)0x0;
    zip_archive.m_pRealloc = (mz_realloc_func)0x0;
    zip_archive.m_file_offset_alignment = 0;
    zip_archive.m_pAlloc = (mz_alloc_func)0x0;
    zip_archive.m_total_files = 0;
    zip_archive.m_zip_mode = MZ_ZIP_MODE_INVALID;
    zip_archive.m_zip_type = MZ_ZIP_TYPE_INVALID;
    zip_archive.m_last_error = MZ_ZIP_NO_ERROR;
    zip_archive.m_archive_size = 0;
    zip_archive.m_central_directory_file_ofs = 0;
    mz_zip_reader_init_file(&zip_archive,url_snapshot_file,0);
    filepath = file_stat.m_filename;
    file_index = 0;
    while( true ) {
      mVar2 = mz_zip_reader_get_num_files(&zip_archive);
      if ((int)mVar2 <= (int)file_index) break;
      mVar3 = mz_zip_reader_file_stat(&zip_archive,file_index,&file_stat);
      if (mVar3 == 0) {
        fwrite("Cannot stat the zip file!\n",0x1a,1,_stderr);
        mz_zip_reader_end(&zip_archive);
        goto LAB_001171c8;
      }
      faup_utils_recursive_mkdir(filepath);
      mVar3 = mz_zip_reader_extract_to_file(&zip_archive,file_index,filepath,0);
      __stream = _stderr;
      if (mVar3 == 0) {
        piVar4 = __errno_location();
        strerror(*piVar4);
        fprintf(__stream,"Error extracting \'%s\': %s\n",filepath);
      }
      file_index = file_index + 1;
    }
    mz_zip_reader_end(&zip_archive);
    free(url_snapshot_file);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int faup_snapshot_file_unzip(char *zipfile)
{

  char *url_snapshot_file = NULL;
  size_t zipfile_len;
  int retval;

  mz_zip_archive zip_archive;
  mz_bool status;
  int i;

  retval = asprintf(&url_snapshot_file, "%s.urls", zipfile);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot file with zip file!\n");
    return -1;
  }

  memset(&zip_archive, 0, sizeof(zip_archive));
  status = mz_zip_reader_init_file(&zip_archive, url_snapshot_file, 0);
  for (i = 0; i < (int)mz_zip_reader_get_num_files(&zip_archive); i++) {
    mz_zip_archive_file_stat file_stat;

    if (!mz_zip_reader_file_stat(&zip_archive, i, &file_stat)) {
      fprintf(stderr, "Cannot stat the zip file!\n");
      mz_zip_reader_end(&zip_archive);
      return -1;
    }

    faup_utils_recursive_mkdir(file_stat.m_filename);

    status = mz_zip_reader_extract_to_file(&zip_archive, i, file_stat.m_filename, 0);
    if (!status) {
      fprintf(stderr, "Error extracting '%s': %s\n", file_stat.m_filename, strerror(errno));
    }
  }

  mz_zip_reader_end(&zip_archive);

  free(url_snapshot_file);

  return 0;
}